

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::DumpAuxiliary
               (OpCode op,OpLayoutAuxiliary *playout,FunctionBody *dumpFunction,
               ByteCodeReader *reader)

{
  Var aValue;
  code *pcVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  VarArrayVarCount *pVVar6;
  PropertyIdArray *pPVar7;
  ScriptContext *this;
  PropertyRecord *pPVar8;
  undefined4 *puVar9;
  AuxArray<double> *pAVar10;
  AuxArray<int> *pAVar11;
  AuxArray<void_*> *pAVar12;
  undefined6 in_register_0000003a;
  uint i;
  ulong uVar13;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,op);
  switch(iVar2) {
  case 0xcb:
    pVVar6 = ByteCodeReader::ReadVarArrayVarCount
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    DumpReg(playout->R0);
    uVar4 = TaggedInt::ToInt32(pVVar6->count);
    Output::Print(L"= %d [",(ulong)uVar4);
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar13 = 0; ((long)uVar13 < (long)(int)uVar4 && (uVar13 < 3)); uVar13 = uVar13 + 1) {
      if (uVar13 != 0) {
        Output::Print(L", ");
      }
      bVar3 = TaggedInt::Is(pVVar6[uVar13 + 1].count);
      aValue = pVVar6[uVar13 + 1].count;
      if (bVar3) {
        uVar5 = TaggedInt::ToInt32(aValue);
        Output::Print(L"%d",(ulong)uVar5);
      }
      else if ((ulong)aValue >> 0x32 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0x600,"(false)","false");
        if (!bVar3) goto LAB_0074aa8c;
        *puVar9 = 0;
      }
      else {
        JavascriptNumber::GetValue(aValue);
        Output::Print(L"%g");
      }
    }
    if (uVar4 == (uint)uVar13) goto LAB_0074aa70;
    goto LAB_0074aa62;
  case 0xcc:
  case 0xcd:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd3:
switchD_0074a6dd_caseD_cc:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x60b,"(false)","Unknown OpCode for OpLayoutType::Auxiliary");
    if (bVar3) {
      *puVar9 = 0;
      return;
    }
LAB_0074aa8c:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case 0xce:
switchD_0074a6dd_caseD_ce:
    pPVar7 = ByteCodeReader::ReadPropertyIdArray
                       ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
    DumpReg(playout->R0);
    Output::Print(L"= %d [",(ulong)pPVar7->count);
    uVar13 = 0;
    while( true ) {
      if ((2 < uVar13) || (pPVar7->count <= uVar13)) break;
      pPVar8 = ScriptContext::GetPropertyName(this,(&pPVar7[1].count)[uVar13]);
      if (uVar13 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%s",pPVar8 + 1);
      uVar13 = uVar13 + 1;
    }
    if (2 < pPVar7->count) {
      Output::Print(L", ...");
    }
    Output::Print(L"], LiteralId %d",(ulong)(uint)(playout->super_OpLayoutAuxNoReg).C1);
    return;
  case 0xd2:
    pAVar11 = ByteCodeReader::ReadAuxArray<int>
                        ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    Output::Print(L" R%d = %d [",(ulong)playout->R0,(ulong)pAVar11->count);
    uVar13 = 0;
    while( true ) {
      uVar4 = pAVar11->count;
      if ((2 < uVar13) || (uVar4 <= uVar13)) break;
      if (uVar13 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pAVar11[uVar13 + 1].count);
      uVar13 = uVar13 + 1;
    }
    break;
  case 0xd4:
    pAVar10 = ByteCodeReader::ReadAuxArray<double>
                        ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    Output::Print(L" R%d = %d [",(ulong)playout->R0,(ulong)pAVar10->count);
    uVar13 = 0;
    while( true ) {
      uVar4 = pAVar10->count;
      if ((2 < uVar13) || (uVar4 <= uVar13)) break;
      if (uVar13 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%f",pAVar10[uVar13 + 1]);
      uVar13 = uVar13 + 1;
    }
    break;
  default:
    if (iVar2 != 0xa3) {
      if (iVar2 == 0xc1) goto switchD_0074a6dd_caseD_ce;
      goto switchD_0074a6dd_caseD_cc;
    }
    pAVar12 = ByteCodeReader::ReadAuxArray<void*>
                        ((playout->super_OpLayoutAuxNoReg).Offset,dumpFunction);
    DumpReg(playout->R0);
    Output::Print(L"= %d [",(ulong)pAVar12->count);
    uVar13 = 0;
    while( true ) {
      uVar4 = pAVar12->count;
      if ((2 < uVar13) || (uVar4 <= uVar13)) break;
      if (uVar13 != 0) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",pAVar12[uVar13 + 1]);
      uVar13 = uVar13 + 1;
    }
  }
  if ((uint)uVar13 != uVar4) {
LAB_0074aa62:
    Output::Print(L", ...");
  }
LAB_0074aa70:
  Output::Print(L"]");
  return;
}

Assistant:

void
    ByteCodeDumper::DumpAuxiliary(OpCode op, const unaligned OpLayoutAuxiliary * playout, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::NewScObjectLiteral:
            case OpCode::LdPropIds:
            {
                const Js::PropertyIdArray *propIds = reader.ReadPropertyIdArray(playout->Offset, dumpFunction);
                ScriptContext* scriptContext = dumpFunction->GetScriptContext();
                DumpReg(playout->R0);
                Output::Print(_u("= %d ["), propIds->count);
                for (uint i=0; i< propIds->count && i < 3; i++)
                {
                    PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propIds->elements[i]);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), pPropertyName->GetBuffer());
                }
                if (propIds->count >= 3)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("], LiteralId %d"), playout->C1);
                break;
            }
            case OpCode::StArrSegItem_A:
            {
                const Js::VarArray *vars = reader.ReadAuxArray<Var>(playout->Offset, dumpFunction);
                DumpReg(playout->R0);
                Output::Print(_u("= %d ["), vars->count);
                uint i=0;
                for (; i<vars->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%d"), vars->elements[i]);
                }
                if (i != vars->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScIntArray:
            {
                const Js::AuxArray<int32> *intArray = reader.ReadAuxArray<int32>(playout->Offset, dumpFunction);
                Output::Print(_u(" R%d = %d ["), playout->R0, intArray->count);
                uint i;
                for (i = 0; i<intArray->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%d"), intArray->elements[i]);
                }
                if (i != intArray->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScFltArray:
            {
                const Js::AuxArray<double> *dblArray = reader.ReadAuxArray<double>(playout->Offset, dumpFunction);
                Output::Print(_u(" R%d = %d ["), playout->R0, dblArray->count);
                uint i;
                for (i = 0; i<dblArray->count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%f"), dblArray->elements[i]);
                }
                if (i != dblArray->count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            case OpCode::NewScObject_A:
            {
                const Js::VarArrayVarCount *vars = reader.ReadVarArrayVarCount(playout->Offset, dumpFunction);
                DumpReg(playout->R0);
                int count = Js::TaggedInt::ToInt32(vars->count);
                Output::Print(_u("= %d ["), count);
                int i=0;
                for (; i<count && i < 3; i++)
                {
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    if (TaggedInt::Is(vars->elements[i]))
                    {
                        Output::Print(_u("%d"), TaggedInt::ToInt32(vars->elements[i]));
                    }
                    else if (JavascriptNumber::Is(vars->elements[i]))
                    {
                        Output::Print(_u("%g"), JavascriptNumber::GetValue(vars->elements[i]));
                    }
                    else
                    {
                        Assert(false);
                    }
                }
                if (i != count)
                {
                    Output::Print(_u(", ..."));
                }
                Output::Print(_u("]"));
                break;
            }
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutType::Auxiliary");
                break;
        }
    }